

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  byte bVar1;
  uchar uVar2;
  ushort uVar3;
  stbi__uint32 sVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  undefined8 uVar8;
  bool bVar9;
  char cVar10;
  stbi__uint16 sVar11;
  int iVar12;
  uint uVar13;
  stbi__uint32 sVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  undefined8 *puVar22;
  stbi_uc *psVar23;
  void *pvVar24;
  stbi__context *data;
  uchar *data_00;
  float *data_01;
  stbi_uc *psVar25;
  stbi__uint16 *data_02;
  byte *pbVar26;
  uchar *puVar27;
  byte bVar28;
  uint uVar29;
  char *pcVar30;
  stbi_uc *psVar31;
  byte *pbVar32;
  stbi_uc sVar33;
  uint uVar34;
  long lVar35;
  int iVar36;
  ulong uVar37;
  int iVar38;
  int iVar39;
  stbi__uint32 sVar40;
  ulong uVar41;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  uint uVar42;
  ulong uVar43;
  stbi__uint16 *psVar44;
  stbi__uint16 *psVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar125 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  int iVar155;
  int iVar159;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  stbi_uc pal [256] [4];
  uint local_8990;
  stbi__uint16 *local_8968;
  ulong local_8958;
  stbi__uint16 *local_8948;
  uint local_893c;
  stbi__bmp_data local_88dc;
  ulong local_88b8;
  ulong local_88b0;
  stbi__gif local_88a8;
  
  psVar31 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  iVar12 = stbi__check_png_header(s);
  psVar25 = s->img_buffer_original;
  s->img_buffer = psVar25;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar12 != 0) {
    local_88a8._0_8_ = s;
    if ((uint)req_comp < 5) {
      iVar12 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      uVar8 = local_88a8._0_8_;
      if (iVar12 == 0) {
        data = (stbi__context *)0x0;
      }
      else {
        iVar12 = 8;
        if ((8 < local_88a8.flags) && (iVar12 = 0x10, local_88a8.flags != 0x10)) {
          puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          pcVar30 = "bad bits_per_channel";
          goto LAB_00128ae8;
        }
        ri->bits_per_channel = iVar12;
        data = (stbi__context *)local_88a8.history;
        if ((req_comp != 0) && (iVar12 = *(int *)(local_88a8._0_8_ + 0xc), iVar12 != req_comp)) {
          if (local_88a8.flags < 9) {
            data = (stbi__context *)
                   stbi__convert_format
                             (local_88a8.history,iVar12,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                              *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            data = (stbi__context *)
                   stbi__convert_format16
                             ((stbi__uint16 *)local_88a8.history,iVar12,req_comp,
                              *(stbi__uint32 *)local_88a8._0_8_,
                              *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar8 + 0xc) = req_comp;
          if (data == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(stbi__uint32 *)uVar8;
        *y = *(stbi__uint32 *)(uVar8 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar8 + 8);
        }
        local_88a8.history = (stbi_uc *)0x0;
      }
      free(local_88a8.history);
      free(local_88a8.background);
      goto LAB_00128f90;
    }
    puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
    pcVar30 = "bad req_comp";
    goto LAB_00128ae8;
  }
  if (psVar25 < s->img_buffer_original_end) {
LAB_00128b25:
    psVar23 = psVar25 + 1;
    s->img_buffer = psVar23;
    if (*psVar25 != 'B') goto LAB_00128cc3;
    if (s->img_buffer_end <= psVar23) {
      if (s->read_from_callbacks == 0) goto LAB_00128cc3;
      stbi__refill_buffer(s);
      psVar23 = s->img_buffer;
    }
    s->img_buffer = psVar23 + 1;
    if (*psVar23 != 'M') goto LAB_00128cc3;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar13 = stbi__get16le(s);
    iVar12 = stbi__get16le(s);
    uVar13 = iVar12 << 0x10 | uVar13;
    if (((0x38 < uVar13) || ((0x100010000001000U >> ((ulong)uVar13 & 0x3f) & 1) == 0)) &&
       (uVar13 != 0x6c)) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (uVar13 == 0x7c) goto LAB_00128bf0;
      goto LAB_00128cd7;
    }
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_00128bf0:
    local_88dc.all_a = 0xff;
    pvVar24 = stbi__bmp_parse_header(s,&local_88dc);
    local_8990 = local_88dc.all_a;
    if (pvVar24 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar13 = s->img_y;
    uVar17 = -uVar13;
    if (0 < (int)uVar13) {
      uVar17 = uVar13;
    }
    s->img_y = uVar17;
    if ((uVar17 < 0x1000001) && (s->img_x < 0x1000001)) {
      if (local_88dc.hsz == 0xc) {
        if (0x17 < local_88dc.bpp) goto LAB_001292a1;
        uVar17 = ((local_88dc.offset - local_88dc.extra_read) + -0x18) / 3;
LAB_001291b9:
        local_8958 = (ulong)uVar17;
        if (uVar17 == 0) goto LAB_001292a1;
        bVar7 = false;
LAB_001291e7:
        bVar9 = local_88dc.ma == 0xff000000;
        iVar12 = 4 - (uint)(local_88dc.ma == 0);
        iVar36 = local_88dc.bpp;
      }
      else {
        if (local_88dc.bpp < 0x10) {
          uVar17 = local_88dc.offset - (local_88dc.extra_read + local_88dc.hsz) >> 2;
          goto LAB_001291b9;
        }
LAB_001292a1:
        iVar12 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                 s->callback_already_read;
        if (iVar12 - 0x401U < 0xfffffc00) {
          puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          pcVar30 = "bad header";
          goto LAB_00128ae8;
        }
        if ((local_88dc.offset < iVar12) || (0x400 < local_88dc.offset - iVar12)) {
          puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          pcVar30 = "bad offset";
          goto LAB_00128ae8;
        }
        stbi__skip(s,local_88dc.offset - iVar12);
        local_8958 = 0;
        bVar9 = true;
        bVar7 = bVar9;
        if (local_88dc.bpp != 0x18 || local_88dc.ma != 0xff000000) goto LAB_001291e7;
        iVar12 = 3;
        iVar36 = 0x18;
        bVar7 = true;
      }
      s->img_n = iVar12;
      if (2 < req_comp) {
        iVar12 = req_comp;
      }
      sVar14 = s->img_x;
      sVar4 = s->img_y;
      iVar16 = stbi__mad3sizes_valid(iVar12,sVar14,sVar4,0);
      if (iVar16 == 0) goto LAB_001296b6;
      data_00 = (uchar *)stbi__malloc_mad3(iVar12,sVar14,sVar4,0);
      if (data_00 != (uchar *)0x0) {
        if (iVar36 < 0x10) {
          iVar16 = (int)local_8958;
          if (!bVar7 && iVar16 < 0x101) {
            if (0 < iVar16) {
              psVar31 = s->img_buffer;
              uVar43 = 0;
              psVar25 = psVar31;
              do {
                psVar23 = s->img_buffer_end;
                if (psVar31 < psVar23) {
LAB_00129508:
                  psVar25 = psVar31 + 1;
                  s->img_buffer = psVar25;
                  sVar33 = *psVar31;
                  psVar31 = psVar25;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar31 = s->img_buffer;
                    psVar23 = s->img_buffer_end;
                    goto LAB_00129508;
                  }
                  sVar33 = '\0';
                }
                local_88a8.pal[uVar43 - 0xd][2] = sVar33;
                if (psVar31 < psVar23) {
LAB_0012954b:
                  psVar25 = psVar31 + 1;
                  s->img_buffer = psVar25;
                  sVar33 = *psVar31;
                  psVar31 = psVar25;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar31 = s->img_buffer;
                    psVar23 = s->img_buffer_end;
                    goto LAB_0012954b;
                  }
                  sVar33 = '\0';
                }
                local_88a8.pal[uVar43 - 0xd][1] = sVar33;
                if (psVar31 < psVar23) {
LAB_00129586:
                  psVar25 = psVar31 + 1;
                  s->img_buffer = psVar25;
                  sVar33 = *psVar31;
                  psVar31 = psVar25;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar31 = s->img_buffer;
                    goto LAB_00129586;
                  }
                  sVar33 = '\0';
                }
                local_88a8.pal[uVar43 - 0xd][0] = sVar33;
                if (local_88dc.hsz != 0xc) {
                  if (s->img_buffer_end <= psVar25) {
                    psVar31 = psVar25;
                    if (s->read_from_callbacks == 0) goto LAB_001295d7;
                    stbi__refill_buffer(s);
                    psVar25 = s->img_buffer;
                  }
                  psVar31 = psVar25 + 1;
                  s->img_buffer = psVar31;
                  psVar25 = psVar31;
                }
LAB_001295d7:
                local_88a8.pal[uVar43 - 0xd][3] = 0xff;
                uVar43 = uVar43 + 1;
              } while (local_8958 != uVar43);
            }
            stbi__skip(s,(iVar16 * (local_88dc.hsz == 0xc | 0xfffffffc) + local_88dc.offset) -
                         (local_88dc.hsz + local_88dc.extra_read));
            if (iVar36 == 1) {
              sVar14 = s->img_y;
              if (0 < (int)sVar14) {
                sVar4 = s->img_x;
                iVar16 = 0;
                iVar36 = 0;
                do {
                  pbVar26 = s->img_buffer;
                  if (pbVar26 < s->img_buffer_end) {
LAB_0012a48c:
                    s->img_buffer = pbVar26 + 1;
                    uVar17 = (uint)*pbVar26;
                    pbVar26 = pbVar26 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar26 = s->img_buffer;
                      goto LAB_0012a48c;
                    }
                    uVar17 = 0;
                  }
                  sVar14 = s->img_x;
                  if (0 < (int)sVar14) {
                    sVar40 = 0;
                    uVar34 = 7;
                    do {
                      uVar43 = (ulong)((uVar17 >> (uVar34 & 0x1f) & 1) != 0);
                      data_00[iVar16] = local_88a8.pal[uVar43 - 0xd][0];
                      data_00[(long)iVar16 + 1] = local_88a8.pal[uVar43 - 0xd][1];
                      data_00[(long)iVar16 + 2] = local_88a8.pal[uVar43 - 0xd][2];
                      iVar39 = iVar16 + 3;
                      if (iVar12 == 4) {
                        data_00[(long)iVar16 + 3] = 0xff;
                        iVar39 = iVar16 + 4;
                      }
                      iVar16 = iVar39;
                      sVar40 = sVar40 + 1;
                      if (sVar40 == sVar14) break;
                      if ((int)uVar34 < 1) {
                        if (s->img_buffer_end <= pbVar26) {
                          if (s->read_from_callbacks == 0) {
                            uVar17 = 0;
                            uVar34 = 7;
                            goto LAB_0012a554;
                          }
                          stbi__refill_buffer(s);
                          pbVar26 = s->img_buffer;
                          sVar14 = s->img_x;
                        }
                        s->img_buffer = pbVar26 + 1;
                        uVar17 = (uint)*pbVar26;
                        uVar34 = 7;
                        pbVar26 = pbVar26 + 1;
                      }
                      else {
                        uVar34 = uVar34 - 1;
                      }
LAB_0012a554:
                    } while ((int)sVar40 < (int)sVar14);
                  }
                  stbi__skip(s,-(sVar4 + 7 >> 3) & 3);
                  iVar36 = iVar36 + 1;
                  sVar14 = s->img_y;
                } while (iVar36 < (int)sVar14);
              }
            }
            else {
              if (iVar36 == 8) {
                uVar17 = s->img_x;
              }
              else {
                if (iVar36 != 4) {
                  free(data_00);
                  puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
                  pcVar30 = "bad bpp";
                  goto LAB_00128ae8;
                }
                uVar17 = s->img_x + 1 >> 1;
              }
              sVar14 = s->img_y;
              if (0 < (int)sVar14) {
                local_8948._0_4_ = -uVar17 & 3;
                uVar43 = 0;
                iVar16 = 0;
                do {
                  if (0 < (int)s->img_x) {
                    pbVar26 = s->img_buffer;
                    iVar39 = 0;
                    do {
                      if (pbVar26 < s->img_buffer_end) {
LAB_0012a2f7:
                        s->img_buffer = pbVar26 + 1;
                        uVar17 = (uint)*pbVar26;
                        pbVar26 = pbVar26 + 1;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          pbVar26 = s->img_buffer;
                          goto LAB_0012a2f7;
                        }
                        uVar17 = 0;
                      }
                      uVar29 = uVar17 & 0xf;
                      uVar34 = uVar17 >> 4;
                      if (iVar36 != 4) {
                        uVar34 = uVar17;
                      }
                      uVar41 = (ulong)uVar34;
                      if (iVar36 != 4) {
                        uVar29 = 0;
                      }
                      lVar35 = (long)(int)uVar43;
                      uVar37 = lVar35 + 3;
                      data_00[lVar35] = local_88a8.pal[uVar41 - 0xd][0];
                      data_00[lVar35 + 1] = local_88a8.pal[uVar41 - 0xd][1];
                      data_00[lVar35 + 2] = local_88a8.pal[uVar41 - 0xd][2];
                      if (iVar12 == 4) {
                        data_00[lVar35 + 3] = 0xff;
                        uVar37 = (ulong)((int)uVar43 + 4);
                      }
                      if (iVar39 + 1U == s->img_x) {
                        uVar43 = uVar37 & 0xffffffff;
                        break;
                      }
                      if (iVar36 == 8) {
                        if (s->img_buffer_end <= pbVar26) {
                          if (s->read_from_callbacks == 0) {
                            uVar29 = 0;
                            goto LAB_0012a3b7;
                          }
                          stbi__refill_buffer(s);
                          pbVar26 = s->img_buffer;
                        }
                        s->img_buffer = pbVar26 + 1;
                        uVar29 = (uint)*pbVar26;
                        pbVar26 = pbVar26 + 1;
                      }
LAB_0012a3b7:
                      lVar35 = (long)(int)uVar37;
                      uVar43 = lVar35 + 3;
                      uVar41 = (ulong)uVar29;
                      data_00[lVar35] = local_88a8.pal[uVar41 - 0xd][0];
                      data_00[lVar35 + 1] = local_88a8.pal[uVar41 - 0xd][1];
                      data_00[lVar35 + 2] = local_88a8.pal[uVar41 - 0xd][2];
                      if (iVar12 == 4) {
                        data_00[lVar35 + 3] = 0xff;
                        uVar43 = (ulong)((int)uVar37 + 4);
                      }
                      iVar39 = iVar39 + 2;
                    } while (iVar39 < (int)s->img_x);
                  }
                  stbi__skip(s,(uint)local_8948);
                  iVar16 = iVar16 + 1;
                  sVar14 = s->img_y;
                } while (iVar16 < (int)sVar14);
              }
            }
            goto LAB_0012a59a;
          }
          free(data_00);
          puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          pcVar30 = "invalid";
          goto LAB_00128ae8;
        }
        stbi__skip(s,local_88dc.offset - (local_88dc.hsz + local_88dc.extra_read));
        if (iVar36 != 0x10) {
          if (iVar36 == 0x20) {
            local_893c = 0;
            if ((bool)((local_88dc.mr == 0xff0000 &&
                       (local_88dc.mg == 0xff00 && local_88dc.mb == 0xff)) & bVar9)) {
              bVar7 = true;
              goto LAB_00129702;
            }
            goto LAB_00129740;
          }
          local_893c = 0;
          if (iVar36 != 0x18) goto LAB_00129740;
          local_893c = s->img_x & 3;
          bVar7 = false;
LAB_00129702:
          bVar9 = false;
          iVar16 = 0;
          iVar39 = 0;
          iVar18 = 0;
          iVar155 = 0;
          uVar17 = 0;
          uVar34 = 0;
          uVar29 = 0;
          uVar19 = 0;
LAB_0012986e:
          sVar14 = s->img_y;
          if (0 < (int)sVar14) {
            uVar43 = 0;
            local_88b0 = (ulong)(uVar29 << 2);
            local_88b8 = (ulong)(uVar19 << 2);
            iVar159 = 0;
            do {
              uVar41 = uVar43;
              if (bVar9) {
                if (0 < (int)s->img_x) {
                  iVar38 = 0;
                  do {
                    uVar20 = stbi__get16le(s);
                    if (iVar36 != 0x10) {
                      iVar21 = stbi__get16le(s);
                      uVar20 = uVar20 | iVar21 << 0x10;
                    }
                    uVar42 = (uVar20 & local_88dc.mr) >> ((byte)iVar16 & 0x1f);
                    if (iVar16 < 0) {
                      uVar42 = (uVar20 & local_88dc.mr) << (-(byte)iVar16 & 0x1f);
                    }
                    uVar15 = (uVar20 & local_88dc.mg) >> ((byte)iVar39 & 0x1f);
                    if (iVar39 < 0) {
                      uVar15 = (uVar20 & local_88dc.mg) << (-(byte)iVar39 & 0x1f);
                    }
                    iVar21 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                     (uVar34 << 2));
                    bVar28 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[uVar34 << 2];
                    uVar6 = (uVar20 & local_88dc.mb) >> ((byte)iVar18 & 0x1f);
                    if (iVar18 < 0) {
                      uVar6 = (uVar20 & local_88dc.mb) << (-(byte)iVar18 & 0x1f);
                    }
                    lVar35 = (long)(int)uVar43;
                    iVar5 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table + local_88b0
                                    );
                    bVar1 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b0];
                    data_00[lVar35] =
                         (uchar)((int)((uVar42 >> (8U - (char)uVar17 & 0x1f)) *
                                      *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                              (uVar17 << 2))) >>
                                (stbi__shiftsigned(unsigned_int,int,int)::shift_table[uVar17 << 2] &
                                0x1f));
                    data_00[lVar35 + 1] =
                         (uchar)((int)((uVar15 >> (8U - (char)uVar34 & 0x1f)) * iVar21) >>
                                (bVar28 & 0x1f));
                    data_00[lVar35 + 2] =
                         (uchar)((int)((uVar6 >> (8U - (char)uVar29 & 0x1f)) * iVar5) >>
                                (bVar1 & 0x1f));
                    if (local_88dc.ma == 0) {
                      uVar20 = 0xff;
                    }
                    else {
                      uVar42 = (uVar20 & local_88dc.ma) >> ((byte)iVar155 & 0x1f);
                      if (iVar155 < 0) {
                        uVar42 = (uVar20 & local_88dc.ma) << (-(byte)iVar155 & 0x1f);
                      }
                      uVar20 = (int)((uVar42 >> (8U - (char)uVar19 & 0x1f)) *
                                    *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                            local_88b8)) >>
                               (stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b8] &
                               0x1f);
                    }
                    uVar41 = lVar35 + 3;
                    if (iVar12 == 4) {
                      data_00[lVar35 + 3] = (uchar)uVar20;
                      uVar41 = (ulong)((int)uVar43 + 4);
                    }
                    local_8990 = local_8990 | uVar20;
                    iVar38 = iVar38 + 1;
                    uVar43 = uVar41 & 0xffffffff;
                  } while (iVar38 < (int)s->img_x);
                }
              }
              else if (0 < (int)s->img_x) {
                pbVar26 = s->img_buffer;
                iVar38 = 0;
                do {
                  pbVar32 = s->img_buffer_end;
                  if (pbVar26 < pbVar32) {
LAB_00129b0b:
                    s->img_buffer = pbVar26 + 1;
                    bVar28 = *pbVar26;
                    pbVar26 = pbVar26 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar26 = s->img_buffer;
                      pbVar32 = s->img_buffer_end;
                      goto LAB_00129b0b;
                    }
                    bVar28 = 0;
                  }
                  lVar35 = (long)(int)uVar43;
                  data_00[lVar35 + 2] = bVar28;
                  if (pbVar26 < pbVar32) {
LAB_00129b52:
                    s->img_buffer = pbVar26 + 1;
                    bVar28 = *pbVar26;
                    pbVar26 = pbVar26 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar26 = s->img_buffer;
                      pbVar32 = s->img_buffer_end;
                      goto LAB_00129b52;
                    }
                    bVar28 = 0;
                  }
                  data_00[lVar35 + 1] = bVar28;
                  if (pbVar26 < pbVar32) {
LAB_00129b8e:
                    s->img_buffer = pbVar26 + 1;
                    bVar28 = *pbVar26;
                    pbVar26 = pbVar26 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar26 = s->img_buffer;
                      goto LAB_00129b8e;
                    }
                    bVar28 = 0;
                  }
                  data_00[lVar35] = bVar28;
                  bVar28 = 0xff;
                  if (bVar7) {
                    if (s->img_buffer_end <= pbVar26) {
                      if (s->read_from_callbacks == 0) {
                        bVar28 = 0;
                        goto LAB_00129be5;
                      }
                      stbi__refill_buffer(s);
                      pbVar26 = s->img_buffer;
                    }
                    s->img_buffer = pbVar26 + 1;
                    bVar28 = *pbVar26;
                    pbVar26 = pbVar26 + 1;
                  }
LAB_00129be5:
                  uVar41 = lVar35 + 3;
                  if (iVar12 == 4) {
                    data_00[lVar35 + 3] = bVar28;
                    uVar41 = (ulong)((int)uVar43 + 4);
                  }
                  local_8990 = local_8990 | bVar28;
                  iVar38 = iVar38 + 1;
                  uVar43 = uVar41 & 0xffffffff;
                } while (iVar38 < (int)s->img_x);
              }
              stbi__skip(s,local_893c);
              iVar159 = iVar159 + 1;
              sVar14 = s->img_y;
              uVar43 = uVar41 & 0xffffffff;
            } while (iVar159 < (int)sVar14);
          }
LAB_0012a59a:
          auVar82 = _DAT_001505f0;
          auVar129 = _DAT_001505e0;
          auVar78 = _DAT_001505d0;
          auVar57 = _DAT_001505c0;
          auVar131 = _DAT_001505b0;
          auVar48 = _DAT_00150500;
          auVar125 = _DAT_001504f0;
          if (((iVar12 == 4) && (local_8990 == 0)) &&
             (uVar17 = s->img_x * sVar14 * 4 - 1, -1 < (int)uVar17)) {
            uVar34 = uVar17 >> 2;
            auVar83._4_4_ = 0;
            auVar83._0_4_ = uVar34;
            auVar83._8_4_ = uVar34;
            auVar83._12_4_ = 0;
            puVar27 = data_00 + uVar17;
            uVar43 = 0;
            auVar52._8_4_ = 0xffffffff;
            auVar52._0_8_ = 0xffffffffffffffff;
            auVar52._12_4_ = 0xffffffff;
            do {
              auVar132._8_4_ = (int)uVar43;
              auVar132._0_8_ = uVar43;
              auVar132._12_4_ = (int)(uVar43 >> 0x20);
              auVar134 = auVar83 | auVar48;
              auVar136 = (auVar132 | auVar125) ^ auVar48;
              iVar36 = auVar134._0_4_;
              iVar155 = -(uint)(iVar36 < auVar136._0_4_);
              iVar16 = auVar134._4_4_;
              auVar138._4_4_ = -(uint)(iVar16 < auVar136._4_4_);
              iVar39 = auVar134._8_4_;
              iVar159 = -(uint)(iVar39 < auVar136._8_4_);
              iVar18 = auVar134._12_4_;
              auVar138._12_4_ = -(uint)(iVar18 < auVar136._12_4_);
              auVar148._4_4_ = iVar155;
              auVar148._0_4_ = iVar155;
              auVar148._8_4_ = iVar159;
              auVar148._12_4_ = iVar159;
              auVar134 = pshuflw(in_XMM1,auVar148,0xe8);
              auVar137._4_4_ = -(uint)(auVar136._4_4_ == iVar16);
              auVar137._12_4_ = -(uint)(auVar136._12_4_ == iVar18);
              auVar137._0_4_ = auVar137._4_4_;
              auVar137._8_4_ = auVar137._12_4_;
              auVar72 = pshuflw(in_XMM2,auVar137,0xe8);
              auVar138._0_4_ = auVar138._4_4_;
              auVar138._8_4_ = auVar138._12_4_;
              auVar136 = pshuflw(auVar134,auVar138,0xe8);
              auVar134 = (auVar136 | auVar72 & auVar134) ^ auVar52;
              auVar134 = packssdw(auVar134,auVar134);
              if ((auVar134 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *puVar27 = 0xff;
              }
              auVar138 = auVar137 & auVar148 | auVar138;
              auVar134 = packssdw(auVar138,auVar138);
              auVar134 = packssdw(auVar134 ^ auVar52,auVar134 ^ auVar52);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134._0_4_ >> 8 & 1) != 0) {
                puVar27[-4] = 0xff;
              }
              auVar134 = (auVar132 | auVar82) ^ auVar48;
              auVar136._0_4_ = -(uint)(iVar36 < auVar134._0_4_);
              auVar136._4_4_ = -(uint)(iVar16 < auVar134._4_4_);
              auVar136._8_4_ = -(uint)(iVar39 < auVar134._8_4_);
              auVar136._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
              auVar72._4_4_ = auVar136._0_4_;
              auVar72._0_4_ = auVar136._0_4_;
              auVar72._8_4_ = auVar136._8_4_;
              auVar72._12_4_ = auVar136._8_4_;
              iVar155 = -(uint)(auVar134._4_4_ == iVar16);
              iVar159 = -(uint)(auVar134._12_4_ == iVar18);
              auVar149._4_4_ = iVar155;
              auVar149._0_4_ = iVar155;
              auVar149._8_4_ = iVar159;
              auVar149._12_4_ = iVar159;
              auVar156._4_4_ = auVar136._4_4_;
              auVar156._0_4_ = auVar136._4_4_;
              auVar156._8_4_ = auVar136._12_4_;
              auVar156._12_4_ = auVar136._12_4_;
              auVar134 = auVar149 & auVar72 | auVar156;
              auVar134 = packssdw(auVar134,auVar134);
              auVar134 = packssdw(auVar134 ^ auVar52,auVar134 ^ auVar52);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134._0_4_ >> 0x10 & 1) != 0) {
                puVar27[-8] = 0xff;
              }
              auVar134 = pshufhw(auVar134,auVar72,0x84);
              auVar72 = pshufhw(auVar136,auVar149,0x84);
              auVar136 = pshufhw(auVar134,auVar156,0x84);
              auVar134 = (auVar136 | auVar72 & auVar134) ^ auVar52;
              auVar134 = packssdw(auVar134,auVar134);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134._0_4_ >> 0x18 & 1) != 0) {
                puVar27[-0xc] = 0xff;
              }
              auVar134 = (auVar132 | auVar129) ^ auVar48;
              auVar73._0_4_ = -(uint)(iVar36 < auVar134._0_4_);
              auVar73._4_4_ = -(uint)(iVar16 < auVar134._4_4_);
              auVar73._8_4_ = -(uint)(iVar39 < auVar134._8_4_);
              auVar73._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
              auVar150._4_4_ = auVar73._0_4_;
              auVar150._0_4_ = auVar73._0_4_;
              auVar150._8_4_ = auVar73._8_4_;
              auVar150._12_4_ = auVar73._8_4_;
              auVar72 = pshuflw(auVar156,auVar150,0xe8);
              auVar54._0_4_ = -(uint)(auVar134._0_4_ == iVar36);
              auVar54._4_4_ = -(uint)(auVar134._4_4_ == iVar16);
              auVar54._8_4_ = -(uint)(auVar134._8_4_ == iVar39);
              auVar54._12_4_ = -(uint)(auVar134._12_4_ == iVar18);
              auVar139._4_4_ = auVar54._4_4_;
              auVar139._0_4_ = auVar54._4_4_;
              auVar139._8_4_ = auVar54._12_4_;
              auVar139._12_4_ = auVar54._12_4_;
              auVar134 = pshuflw(auVar54,auVar139,0xe8);
              auVar140._4_4_ = auVar73._4_4_;
              auVar140._0_4_ = auVar73._4_4_;
              auVar140._8_4_ = auVar73._12_4_;
              auVar140._12_4_ = auVar73._12_4_;
              auVar136 = pshuflw(auVar73,auVar140,0xe8);
              auVar134 = packssdw(auVar134 & auVar72,(auVar136 | auVar134 & auVar72) ^ auVar52);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar27[-0x10] = 0xff;
              }
              auVar140 = auVar139 & auVar150 | auVar140;
              auVar136 = packssdw(auVar140,auVar140);
              auVar134 = packssdw(auVar134,auVar136 ^ auVar52);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134._4_2_ >> 8 & 1) != 0) {
                puVar27[-0x14] = 0xff;
              }
              auVar134 = (auVar132 | auVar78) ^ auVar48;
              auVar74._0_4_ = -(uint)(iVar36 < auVar134._0_4_);
              auVar74._4_4_ = -(uint)(iVar16 < auVar134._4_4_);
              auVar74._8_4_ = -(uint)(iVar39 < auVar134._8_4_);
              auVar74._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
              auVar141._4_4_ = auVar74._0_4_;
              auVar141._0_4_ = auVar74._0_4_;
              auVar141._8_4_ = auVar74._8_4_;
              auVar141._12_4_ = auVar74._8_4_;
              iVar155 = -(uint)(auVar134._4_4_ == iVar16);
              iVar159 = -(uint)(auVar134._12_4_ == iVar18);
              auVar151._4_4_ = iVar155;
              auVar151._0_4_ = iVar155;
              auVar151._8_4_ = iVar159;
              auVar151._12_4_ = iVar159;
              auVar157._4_4_ = auVar74._4_4_;
              auVar157._0_4_ = auVar74._4_4_;
              auVar157._8_4_ = auVar74._12_4_;
              auVar157._12_4_ = auVar74._12_4_;
              auVar134 = auVar151 & auVar141 | auVar157;
              auVar134 = packssdw(auVar134,auVar134);
              auVar134 = packssdw(auVar134 ^ auVar52,auVar134 ^ auVar52);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar27[-0x18] = 0xff;
              }
              auVar134 = pshufhw(auVar134,auVar141,0x84);
              auVar72 = pshufhw(auVar74,auVar151,0x84);
              auVar136 = pshufhw(auVar134,auVar157,0x84);
              auVar134 = (auVar136 | auVar72 & auVar134) ^ auVar52;
              auVar134 = packssdw(auVar134,auVar134);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134._6_2_ >> 8 & 1) != 0) {
                puVar27[-0x1c] = 0xff;
              }
              auVar134 = (auVar132 | auVar57) ^ auVar48;
              auVar75._0_4_ = -(uint)(iVar36 < auVar134._0_4_);
              auVar75._4_4_ = -(uint)(iVar16 < auVar134._4_4_);
              auVar75._8_4_ = -(uint)(iVar39 < auVar134._8_4_);
              auVar75._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
              auVar152._4_4_ = auVar75._0_4_;
              auVar152._0_4_ = auVar75._0_4_;
              auVar152._8_4_ = auVar75._8_4_;
              auVar152._12_4_ = auVar75._8_4_;
              auVar72 = pshuflw(auVar157,auVar152,0xe8);
              auVar55._0_4_ = -(uint)(auVar134._0_4_ == iVar36);
              auVar55._4_4_ = -(uint)(auVar134._4_4_ == iVar16);
              auVar55._8_4_ = -(uint)(auVar134._8_4_ == iVar39);
              auVar55._12_4_ = -(uint)(auVar134._12_4_ == iVar18);
              auVar142._4_4_ = auVar55._4_4_;
              auVar142._0_4_ = auVar55._4_4_;
              auVar142._8_4_ = auVar55._12_4_;
              auVar142._12_4_ = auVar55._12_4_;
              auVar134 = pshuflw(auVar55,auVar142,0xe8);
              auVar143._4_4_ = auVar75._4_4_;
              auVar143._0_4_ = auVar75._4_4_;
              auVar143._8_4_ = auVar75._12_4_;
              auVar143._12_4_ = auVar75._12_4_;
              auVar136 = pshuflw(auVar75,auVar143,0xe8);
              auVar136 = (auVar136 | auVar134 & auVar72) ^ auVar52;
              auVar136 = packssdw(auVar136,auVar136);
              auVar134 = packsswb(auVar134 & auVar72,auVar136);
              if ((auVar134 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar27[-0x20] = 0xff;
              }
              auVar143 = auVar142 & auVar152 | auVar143;
              auVar136 = packssdw(auVar143,auVar143);
              auVar136 = packssdw(auVar136 ^ auVar52,auVar136 ^ auVar52);
              auVar134 = packsswb(auVar134,auVar136);
              if ((auVar134._8_2_ >> 8 & 1) != 0) {
                puVar27[-0x24] = 0xff;
              }
              auVar134 = (auVar132 | auVar131) ^ auVar48;
              auVar76._0_4_ = -(uint)(iVar36 < auVar134._0_4_);
              auVar76._4_4_ = -(uint)(iVar16 < auVar134._4_4_);
              auVar76._8_4_ = -(uint)(iVar39 < auVar134._8_4_);
              auVar76._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
              auVar144._4_4_ = auVar76._0_4_;
              auVar144._0_4_ = auVar76._0_4_;
              auVar144._8_4_ = auVar76._8_4_;
              auVar144._12_4_ = auVar76._8_4_;
              iVar155 = -(uint)(auVar134._4_4_ == iVar16);
              iVar159 = -(uint)(auVar134._12_4_ == iVar18);
              auVar153._4_4_ = iVar155;
              auVar153._0_4_ = iVar155;
              auVar153._8_4_ = iVar159;
              auVar153._12_4_ = iVar159;
              auVar158._4_4_ = auVar76._4_4_;
              auVar158._0_4_ = auVar76._4_4_;
              auVar158._8_4_ = auVar76._12_4_;
              auVar158._12_4_ = auVar76._12_4_;
              auVar134 = auVar153 & auVar144 | auVar158;
              auVar134 = packssdw(auVar134,auVar134);
              auVar134 = packssdw(auVar134 ^ auVar52,auVar134 ^ auVar52);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar27[-0x28] = 0xff;
              }
              auVar134 = pshufhw(auVar134,auVar144,0x84);
              auVar72 = pshufhw(auVar76,auVar153,0x84);
              auVar136 = pshufhw(auVar134,auVar158,0x84);
              auVar134 = (auVar136 | auVar72 & auVar134) ^ auVar52;
              auVar134 = packssdw(auVar134,auVar134);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134._10_2_ >> 8 & 1) != 0) {
                puVar27[-0x2c] = 0xff;
              }
              auVar134 = (auVar132 | _DAT_001505a0) ^ auVar48;
              auVar77._0_4_ = -(uint)(iVar36 < auVar134._0_4_);
              auVar77._4_4_ = -(uint)(iVar16 < auVar134._4_4_);
              auVar77._8_4_ = -(uint)(iVar39 < auVar134._8_4_);
              auVar77._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
              auVar154._4_4_ = auVar77._0_4_;
              auVar154._0_4_ = auVar77._0_4_;
              auVar154._8_4_ = auVar77._8_4_;
              auVar154._12_4_ = auVar77._8_4_;
              auVar72 = pshuflw(auVar158,auVar154,0xe8);
              auVar56._0_4_ = -(uint)(auVar134._0_4_ == iVar36);
              auVar56._4_4_ = -(uint)(auVar134._4_4_ == iVar16);
              auVar56._8_4_ = -(uint)(auVar134._8_4_ == iVar39);
              auVar56._12_4_ = -(uint)(auVar134._12_4_ == iVar18);
              auVar145._4_4_ = auVar56._4_4_;
              auVar145._0_4_ = auVar56._4_4_;
              auVar145._8_4_ = auVar56._12_4_;
              auVar145._12_4_ = auVar56._12_4_;
              auVar134 = pshuflw(auVar56,auVar145,0xe8);
              auVar146._4_4_ = auVar77._4_4_;
              auVar146._0_4_ = auVar77._4_4_;
              auVar146._8_4_ = auVar77._12_4_;
              auVar146._12_4_ = auVar77._12_4_;
              auVar136 = pshuflw(auVar77,auVar146,0xe8);
              auVar134 = packssdw(auVar134 & auVar72,(auVar136 | auVar134 & auVar72) ^ auVar52);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar27[-0x30] = 0xff;
              }
              auVar146 = auVar145 & auVar154 | auVar146;
              auVar136 = packssdw(auVar146,auVar146);
              auVar134 = packssdw(auVar134,auVar136 ^ auVar52);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134._12_2_ >> 8 & 1) != 0) {
                puVar27[-0x34] = 0xff;
              }
              auVar136 = (auVar132 | _DAT_00150590) ^ auVar48;
              auVar134._0_4_ = -(uint)(iVar36 < auVar136._0_4_);
              auVar134._4_4_ = -(uint)(iVar16 < auVar136._4_4_);
              auVar134._8_4_ = -(uint)(iVar39 < auVar136._8_4_);
              auVar134._12_4_ = -(uint)(iVar18 < auVar136._12_4_);
              auVar147._4_4_ = auVar134._0_4_;
              auVar147._0_4_ = auVar134._0_4_;
              auVar147._8_4_ = auVar134._8_4_;
              auVar147._12_4_ = auVar134._8_4_;
              auVar133._4_4_ = -(uint)(auVar136._4_4_ == iVar16);
              auVar133._12_4_ = -(uint)(auVar136._12_4_ == iVar18);
              auVar133._0_4_ = auVar133._4_4_;
              auVar133._8_4_ = auVar133._12_4_;
              auVar135._4_4_ = auVar134._4_4_;
              auVar135._0_4_ = auVar134._4_4_;
              auVar135._8_4_ = auVar134._12_4_;
              auVar135._12_4_ = auVar134._12_4_;
              auVar136 = auVar133 & auVar147 | auVar135;
              auVar134 = packssdw(auVar134,auVar136);
              auVar134 = packssdw(auVar134 ^ auVar52,auVar134 ^ auVar52);
              auVar134 = packsswb(auVar134,auVar134);
              if ((auVar134 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar27[-0x38] = 0xff;
              }
              auVar134 = pshufhw(auVar134,auVar147,0x84);
              in_XMM2 = pshufhw(auVar136,auVar133,0x84);
              in_XMM2 = in_XMM2 & auVar134;
              auVar134 = pshufhw(auVar134,auVar135,0x84);
              auVar134 = (auVar134 | in_XMM2) ^ auVar52;
              auVar134 = packssdw(auVar134,auVar134);
              in_XMM1 = packsswb(auVar134,auVar134);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                puVar27[-0x3c] = 0xff;
              }
              uVar43 = uVar43 + 0x10;
              puVar27 = puVar27 + -0x40;
            } while ((uVar34 + 0x10 & 0x3ffffff0) != uVar43);
          }
          if ((int)uVar13 < 1) {
            uVar13 = s->img_x;
          }
          else {
            uVar13 = s->img_x;
            if (0 < (int)sVar14 >> 1) {
              uVar17 = uVar13 * iVar12;
              uVar34 = (sVar14 - 1) * uVar17;
              uVar43 = 0;
              uVar41 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar37 = 0;
                  do {
                    uVar2 = data_00[uVar37 + uVar43];
                    data_00[uVar37 + uVar43] = data_00[uVar37 + uVar34];
                    data_00[uVar37 + uVar34] = uVar2;
                    uVar37 = uVar37 + 1;
                  } while (uVar17 != uVar37);
                }
                uVar41 = uVar41 + 1;
                uVar34 = uVar34 - uVar17;
                uVar43 = (ulong)((int)uVar43 + uVar17);
              } while (uVar41 != (uint)((int)sVar14 >> 1));
            }
          }
          if ((req_comp != 0) && (iVar12 != req_comp)) {
            data_00 = stbi__convert_format(data_00,iVar12,req_comp,uVar13,sVar14);
            if (data_00 == (uchar *)0x0) {
              return (void *)0x0;
            }
            uVar13 = s->img_x;
          }
          *x = uVar13;
          *y = s->img_y;
          if (comp != (int *)0x0) {
            *comp = s->img_n;
            return data_00;
          }
          return data_00;
        }
        local_893c = s->img_x * 2 & 2;
LAB_00129740:
        if ((local_88dc.mg != 0 && local_88dc.mr != 0) && local_88dc.mb != 0) {
          iVar16 = stbi__high_bit(local_88dc.mr);
          uVar17 = stbi__bitcount(local_88dc.mr);
          iVar39 = stbi__high_bit(local_88dc.mg);
          uVar34 = stbi__bitcount(local_88dc.mg);
          iVar18 = stbi__high_bit(local_88dc.mb);
          uVar29 = stbi__bitcount(local_88dc.mb);
          iVar155 = stbi__high_bit(local_88dc.ma);
          uVar19 = stbi__bitcount(local_88dc.ma);
          if ((uVar29 < 9 && (uVar34 < 9 && uVar17 < 9)) && uVar19 < 9) {
            iVar16 = iVar16 + -7;
            iVar39 = iVar39 + -7;
            iVar18 = iVar18 + -7;
            iVar155 = iVar155 + -7;
            bVar9 = true;
            bVar7 = false;
            goto LAB_0012986e;
          }
        }
        free(data_00);
        puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
        pcVar30 = "bad masks";
        goto LAB_00128ae8;
      }
LAB_0012a270:
      puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
      pcVar30 = "outofmem";
      goto LAB_00128ae8;
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar25 = s->img_buffer;
      goto LAB_00128b25;
    }
LAB_00128cc3:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_00128cd7:
    iVar12 = stbi__gif_test(s);
    if (iVar12 != 0) {
      memset(&local_88a8,0,0x8870);
      data = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar31);
      if (data == (stbi__context *)0x0 || data == s) {
        if (local_88a8.out != (stbi_uc *)0x0) {
          free(local_88a8.out);
        }
        data = (stbi__context *)0x0;
      }
      else {
        *x = local_88a8.w;
        *y = local_88a8.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          data = (stbi__context *)
                 stbi__convert_format((uchar *)data,4,req_comp,local_88a8.w,local_88a8.h);
        }
      }
      free(local_88a8.history);
      local_88a8.out = local_88a8.background;
LAB_00128f90:
      free(local_88a8.out);
      return data;
    }
    iVar12 = stbi__get16be(s);
    uVar13 = stbi__get16be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if ((uVar13 | iVar12 << 0x10) != 0x38425053) {
      iVar12 = stbi__pic_test(s);
      if (iVar12 != 0) {
        pvVar24 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar24;
      }
      iVar12 = stbi__jpeg_test(s);
      if (iVar12 != 0) {
        pvVar24 = stbi__jpeg_load(s,x,y,comp,req_comp,ri_00);
        return pvVar24;
      }
      iVar12 = stbi__pnm_test(s);
      if (iVar12 != 0) {
        pvVar24 = stbi__pnm_load(s,x,y,comp,req_comp,ri);
        return pvVar24;
      }
      iVar12 = stbi__hdr_test(s);
      if (iVar12 != 0) {
        data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar25 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
        return psVar25;
      }
      iVar12 = stbi__tga_test(s);
      if (iVar12 != 0) {
        pvVar24 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar24;
      }
      puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
      pcVar30 = "unknown image type";
      goto LAB_00128ae8;
    }
    iVar12 = stbi__get16be(s);
    uVar13 = stbi__get16be(s);
    if ((uVar13 | iVar12 << 0x10) != 0x38425053) {
      puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
      pcVar30 = "not PSD";
      goto LAB_00128ae8;
    }
    iVar12 = stbi__get16be(s);
    if (iVar12 != 1) {
      puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
      pcVar30 = "wrong version";
      goto LAB_00128ae8;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
      psVar25 = s->img_buffer;
LAB_00129063:
      s->img_buffer = psVar25 + 6;
    }
    else {
      psVar25 = s->img_buffer;
      iVar12 = (int)s->img_buffer_end - (int)psVar25;
      if (5 < iVar12) goto LAB_00129063;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar12);
    }
    uVar13 = stbi__get16be(s);
    if (0x10 < uVar13) {
      puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
      pcVar30 = "wrong channel count";
      goto LAB_00128ae8;
    }
    iVar12 = stbi__get16be(s);
    uVar19 = iVar12 * 0x10000;
    uVar17 = stbi__get16be(s);
    uVar29 = uVar19 + uVar17;
    iVar12 = stbi__get16be(s);
    uVar34 = stbi__get16be(s);
    if ((int)uVar29 < 0x1000001) {
      uVar42 = iVar12 * 0x10000;
      uVar20 = uVar42 + uVar34;
      if ((int)uVar20 < 0x1000001) {
        iVar12 = stbi__get16be(s);
        if ((iVar12 != 8) && (iVar12 != 0x10)) {
          puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          pcVar30 = "unsupported bit depth";
          goto LAB_00128ae8;
        }
        iVar36 = stbi__get16be(s);
        if (iVar36 != 3) {
          puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          pcVar30 = "wrong color format";
          goto LAB_00128ae8;
        }
        sVar14 = stbi__get32be(s);
        stbi__skip(s,sVar14);
        sVar14 = stbi__get32be(s);
        stbi__skip(s,sVar14);
        sVar14 = stbi__get32be(s);
        stbi__skip(s,sVar14);
        uVar15 = stbi__get16be(s);
        if (1 < uVar15) {
          puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
          pcVar30 = "bad compression";
          goto LAB_00128ae8;
        }
        iVar36 = stbi__mad3sizes_valid(4,uVar20,uVar29,0);
        if (iVar36 != 0) {
          if (((bpc == 0x10) && (iVar12 == 0x10)) && (uVar15 == 0)) {
            data_02 = (stbi__uint16 *)stbi__malloc_mad3(8,uVar20,uVar29,0);
            ri->bits_per_channel = 0x10;
          }
          else {
            data_02 = (stbi__uint16 *)malloc((long)(int)(uVar29 * uVar20 * 4));
          }
          if (data_02 != (stbi__uint16 *)0x0) {
            iVar36 = uVar20 * uVar29;
            if (uVar15 == 0) {
              lVar35 = (ulong)((uVar17 | uVar19) * (uVar34 | uVar42)) - 1;
              auVar48._8_4_ = (int)lVar35;
              auVar48._0_8_ = lVar35;
              auVar48._12_4_ = (int)((ulong)lVar35 >> 0x20);
              psVar45 = data_02 + 0x1e;
              uVar15 = (uVar17 + uVar19) * (uVar34 + uVar42);
              psVar44 = data_02 + 0x1c;
              uVar43 = 0;
              auVar131._8_4_ = 0xffffffff;
              auVar131._0_8_ = 0xffffffffffffffff;
              auVar131._12_4_ = 0xffffffff;
              auVar125 = _DAT_00150500;
              local_8968 = data_02;
              local_8948 = data_02;
              do {
                if (uVar43 < uVar13) {
                  if (ri->bits_per_channel == 0x10) {
                    if (0 < iVar36) {
                      lVar35 = 0;
                      do {
                        iVar16 = stbi__get16be(s);
                        auVar125 = _DAT_00150500;
                        auVar131._8_4_ = 0xffffffff;
                        auVar131._0_8_ = 0xffffffffffffffff;
                        auVar131._12_4_ = 0xffffffff;
                        local_8968[lVar35 * 4] = (stbi__uint16)iVar16;
                        lVar35 = lVar35 + 1;
                      } while (uVar15 != (uint)lVar35);
                    }
                  }
                  else if (iVar12 == 0x10) {
                    if (0 < iVar36) {
                      lVar35 = 0;
                      do {
                        iVar16 = stbi__get16be(s);
                        auVar125 = _DAT_00150500;
                        auVar131._8_4_ = 0xffffffff;
                        auVar131._0_8_ = 0xffffffffffffffff;
                        auVar131._12_4_ = 0xffffffff;
                        *(char *)(local_8948 + lVar35 * 2) = (char)((uint)iVar16 >> 8);
                        lVar35 = lVar35 + 1;
                      } while (uVar15 - (int)lVar35 != 0);
                    }
                  }
                  else if (0 < iVar36) {
                    psVar25 = s->img_buffer;
                    lVar35 = 0;
                    do {
                      if (psVar25 < s->img_buffer_end) {
LAB_0012b42d:
                        s->img_buffer = psVar25 + 1;
                        sVar33 = *psVar25;
                        psVar25 = psVar25 + 1;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          auVar131._8_4_ = 0xffffffff;
                          auVar131._0_8_ = 0xffffffffffffffff;
                          auVar131._12_4_ = 0xffffffff;
                          psVar25 = s->img_buffer;
                          auVar125 = _DAT_00150500;
                          goto LAB_0012b42d;
                        }
                        sVar33 = '\0';
                      }
                      *(stbi_uc *)(local_8948 + lVar35 * 2) = sVar33;
                      lVar35 = lVar35 + 1;
                    } while (uVar15 - (int)lVar35 != 0);
                  }
                }
                else if (iVar12 == 0x10 && bpc == 0x10) {
                  if (0 < iVar36) {
                    sVar11 = -(ushort)(uVar43 == 3);
                    uVar41 = 0;
                    do {
                      auVar49._8_4_ = (int)uVar41;
                      auVar49._0_8_ = uVar41;
                      auVar49._12_4_ = (int)(uVar41 >> 0x20);
                      auVar57 = auVar48 ^ auVar125;
                      auVar78 = (auVar49 | _DAT_001504f0) ^ auVar125;
                      iVar16 = auVar57._0_4_;
                      iVar159 = -(uint)(iVar16 < auVar78._0_4_);
                      iVar39 = auVar57._4_4_;
                      auVar80._4_4_ = -(uint)(iVar39 < auVar78._4_4_);
                      iVar18 = auVar57._8_4_;
                      iVar38 = -(uint)(iVar18 < auVar78._8_4_);
                      iVar155 = auVar57._12_4_;
                      auVar80._12_4_ = -(uint)(iVar155 < auVar78._12_4_);
                      auVar105._4_4_ = iVar159;
                      auVar105._0_4_ = iVar159;
                      auVar105._8_4_ = iVar38;
                      auVar105._12_4_ = iVar38;
                      auVar57 = pshuflw(in_XMM5,auVar105,0xe8);
                      auVar79._4_4_ = -(uint)(auVar78._4_4_ == iVar39);
                      auVar79._12_4_ = -(uint)(auVar78._12_4_ == iVar155);
                      auVar79._0_4_ = auVar79._4_4_;
                      auVar79._8_4_ = auVar79._12_4_;
                      auVar129 = pshuflw(in_XMM6,auVar79,0xe8);
                      auVar80._0_4_ = auVar80._4_4_;
                      auVar80._8_4_ = auVar80._12_4_;
                      auVar78 = pshuflw(auVar57,auVar80,0xe8);
                      auVar78 = (auVar78 | auVar129 & auVar57) ^ auVar131;
                      auVar78 = packssdw(auVar78,auVar78);
                      if ((auVar78 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        psVar44[uVar41 * 4 + 0xffffffffffffffe4] = sVar11;
                      }
                      auVar80 = auVar79 & auVar105 | auVar80;
                      auVar78 = packssdw(auVar80,auVar80);
                      auVar78 = packssdw(auVar78 ^ auVar131,auVar78 ^ auVar131);
                      if ((auVar78._0_4_ >> 0x10 & 1) != 0) {
                        psVar44[uVar41 * 4 + 0xffffffffffffffe8] = sVar11;
                      }
                      auVar78 = (auVar49 | _DAT_001505f0) ^ auVar125;
                      iVar159 = -(uint)(iVar16 < auVar78._0_4_);
                      auVar121._4_4_ = -(uint)(iVar39 < auVar78._4_4_);
                      iVar38 = -(uint)(iVar18 < auVar78._8_4_);
                      auVar121._12_4_ = -(uint)(iVar155 < auVar78._12_4_);
                      auVar81._4_4_ = iVar159;
                      auVar81._0_4_ = iVar159;
                      auVar81._8_4_ = iVar38;
                      auVar81._12_4_ = iVar38;
                      auVar106._4_4_ = -(uint)(auVar78._4_4_ == iVar39);
                      auVar106._12_4_ = -(uint)(auVar78._12_4_ == iVar155);
                      auVar106._0_4_ = auVar106._4_4_;
                      auVar106._8_4_ = auVar106._12_4_;
                      auVar121._0_4_ = auVar121._4_4_;
                      auVar121._8_4_ = auVar121._12_4_;
                      auVar78 = auVar106 & auVar81 | auVar121;
                      auVar78 = packssdw(auVar78,auVar78);
                      auVar78 = packssdw(auVar78 ^ auVar131,auVar78 ^ auVar131);
                      if ((auVar78 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        psVar44[uVar41 * 4 + 0xffffffffffffffec] = sVar11;
                      }
                      auVar82 = pshufhw(auVar81,auVar81,0x84);
                      auVar52 = pshufhw(auVar106,auVar106,0x84);
                      auVar83 = pshufhw(auVar82,auVar121,0x84);
                      auVar82 = (auVar83 | auVar52 & auVar82) ^ auVar131;
                      auVar82 = packssdw(auVar82,auVar82);
                      if ((auVar82 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        psVar44[uVar41 * 4 + 0xfffffffffffffff0] = sVar11;
                      }
                      auVar82 = (auVar49 | _DAT_001505e0) ^ auVar125;
                      iVar159 = -(uint)(iVar16 < auVar82._0_4_);
                      auVar85._4_4_ = -(uint)(iVar39 < auVar82._4_4_);
                      iVar38 = -(uint)(iVar18 < auVar82._8_4_);
                      auVar85._12_4_ = -(uint)(iVar155 < auVar82._12_4_);
                      auVar107._4_4_ = iVar159;
                      auVar107._0_4_ = iVar159;
                      auVar107._8_4_ = iVar38;
                      auVar107._12_4_ = iVar38;
                      auVar78 = pshuflw(auVar78,auVar107,0xe8);
                      auVar84._4_4_ = -(uint)(auVar82._4_4_ == iVar39);
                      auVar84._12_4_ = -(uint)(auVar82._12_4_ == iVar155);
                      auVar84._0_4_ = auVar84._4_4_;
                      auVar84._8_4_ = auVar84._12_4_;
                      in_XMM6 = pshuflw(auVar129 & auVar57,auVar84,0xe8);
                      in_XMM6 = in_XMM6 & auVar78;
                      auVar85._0_4_ = auVar85._4_4_;
                      auVar85._8_4_ = auVar85._12_4_;
                      auVar57 = pshuflw(auVar78,auVar85,0xe8);
                      auVar57 = (auVar57 | in_XMM6) ^ auVar131;
                      in_XMM5 = packssdw(auVar57,auVar57);
                      if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        psVar44[uVar41 * 4 + 0xfffffffffffffff4] = sVar11;
                      }
                      auVar85 = auVar84 & auVar107 | auVar85;
                      auVar57 = packssdw(auVar85,auVar85);
                      auVar57 = packssdw(auVar57 ^ auVar131,auVar57 ^ auVar131);
                      if ((auVar57 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        psVar44[uVar41 * 4 + 0xfffffffffffffff8] = sVar11;
                      }
                      auVar57 = (auVar49 | _DAT_001505d0) ^ auVar125;
                      auVar108._0_4_ = -(uint)(iVar16 < auVar57._0_4_);
                      auVar108._4_4_ = -(uint)(iVar39 < auVar57._4_4_);
                      auVar108._8_4_ = -(uint)(iVar18 < auVar57._8_4_);
                      auVar108._12_4_ = -(uint)(iVar155 < auVar57._12_4_);
                      auVar86._4_4_ = auVar108._0_4_;
                      auVar86._0_4_ = auVar108._0_4_;
                      auVar86._8_4_ = auVar108._8_4_;
                      auVar86._12_4_ = auVar108._8_4_;
                      auVar50._4_4_ = -(uint)(auVar57._4_4_ == iVar39);
                      auVar50._12_4_ = -(uint)(auVar57._12_4_ == iVar155);
                      auVar50._0_4_ = auVar50._4_4_;
                      auVar50._8_4_ = auVar50._12_4_;
                      auVar58._4_4_ = auVar108._4_4_;
                      auVar58._0_4_ = auVar108._4_4_;
                      auVar58._8_4_ = auVar108._12_4_;
                      auVar58._12_4_ = auVar108._12_4_;
                      auVar57 = packssdw(auVar108,auVar50 & auVar86 | auVar58);
                      auVar57 = packssdw(auVar57 ^ auVar131,auVar57 ^ auVar131);
                      if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        psVar44[uVar41 * 4 + 0xfffffffffffffffc] = sVar11;
                      }
                      auVar129 = pshufhw(auVar86,auVar86,0x84);
                      auVar57 = pshufhw(auVar50,auVar50,0x84);
                      auVar78 = pshufhw(auVar58,auVar58,0x84);
                      auVar57 = packssdw(auVar57 & auVar129,
                                         (auVar78 | auVar57 & auVar129) ^ auVar131);
                      if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        psVar44[uVar41 * 4] = sVar11;
                      }
                      uVar41 = uVar41 + 8;
                    } while (((ulong)uVar15 + 7 & 0xfffffffffffffff8) != uVar41);
                  }
                }
                else if (0 < iVar36) {
                  cVar10 = -(uVar43 == 3);
                  uVar41 = 0;
                  do {
                    auVar57._8_4_ = (int)uVar41;
                    auVar57._0_8_ = uVar41;
                    auVar57._12_4_ = (int)(uVar41 >> 0x20);
                    auVar78 = auVar48 ^ auVar125;
                    auVar129 = (auVar57 | _DAT_001504f0) ^ auVar125;
                    iVar16 = auVar78._0_4_;
                    iVar159 = -(uint)(iVar16 < auVar129._0_4_);
                    iVar39 = auVar78._4_4_;
                    auVar82._4_4_ = -(uint)(iVar39 < auVar129._4_4_);
                    iVar18 = auVar78._8_4_;
                    iVar38 = -(uint)(iVar18 < auVar129._8_4_);
                    iVar155 = auVar78._12_4_;
                    auVar82._12_4_ = -(uint)(iVar155 < auVar129._12_4_);
                    auVar109._4_4_ = iVar159;
                    auVar109._0_4_ = iVar159;
                    auVar109._8_4_ = iVar38;
                    auVar109._12_4_ = iVar38;
                    auVar83 = pshuflw(in_XMM5,auVar109,0xe8);
                    auVar78._4_4_ = -(uint)(auVar129._4_4_ == iVar39);
                    auVar78._12_4_ = -(uint)(auVar129._12_4_ == iVar155);
                    auVar78._0_4_ = auVar78._4_4_;
                    auVar78._8_4_ = auVar78._12_4_;
                    auVar52 = pshuflw(in_XMM6,auVar78,0xe8);
                    auVar82._0_4_ = auVar82._4_4_;
                    auVar82._8_4_ = auVar82._12_4_;
                    auVar129 = pshuflw(auVar83,auVar82,0xe8);
                    auVar129 = (auVar129 | auVar52 & auVar83) ^ auVar131;
                    auVar129 = packssdw(auVar129,auVar129);
                    if ((auVar129 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar45 + uVar41 * 2 + 0xffffffffffffffe2) = cVar10;
                    }
                    auVar82 = auVar78 & auVar109 | auVar82;
                    auVar78 = packssdw(auVar82,auVar82);
                    auVar78 = packssdw(auVar78 ^ auVar131,auVar78 ^ auVar131);
                    auVar78 = packsswb(auVar78,auVar78);
                    if ((auVar78._0_4_ >> 8 & 1) != 0) {
                      *(char *)(psVar45 + uVar41 * 2 + 0xffffffffffffffe4) = cVar10;
                    }
                    auVar78 = (auVar57 | _DAT_001505f0) ^ auVar125;
                    iVar159 = -(uint)(iVar16 < auVar78._0_4_);
                    auVar122._4_4_ = -(uint)(iVar39 < auVar78._4_4_);
                    iVar38 = -(uint)(iVar18 < auVar78._8_4_);
                    auVar122._12_4_ = -(uint)(iVar155 < auVar78._12_4_);
                    auVar129._4_4_ = iVar159;
                    auVar129._0_4_ = iVar159;
                    auVar129._8_4_ = iVar38;
                    auVar129._12_4_ = iVar38;
                    auVar110._4_4_ = -(uint)(auVar78._4_4_ == iVar39);
                    auVar110._12_4_ = -(uint)(auVar78._12_4_ == iVar155);
                    auVar110._0_4_ = auVar110._4_4_;
                    auVar110._8_4_ = auVar110._12_4_;
                    auVar122._0_4_ = auVar122._4_4_;
                    auVar122._8_4_ = auVar122._12_4_;
                    auVar78 = auVar110 & auVar129 | auVar122;
                    auVar78 = packssdw(auVar78,auVar78);
                    auVar78 = packssdw(auVar78 ^ auVar131,auVar78 ^ auVar131);
                    auVar78 = packsswb(auVar78,auVar78);
                    if ((auVar78._0_4_ >> 0x10 & 1) != 0) {
                      *(char *)(psVar45 + uVar41 * 2 + 0xffffffffffffffe6) = cVar10;
                    }
                    auVar129 = pshufhw(auVar129,auVar129,0x84);
                    auVar134 = pshufhw(auVar110,auVar110,0x84);
                    auVar82 = pshufhw(auVar129,auVar122,0x84);
                    auVar129 = (auVar82 | auVar134 & auVar129) ^ auVar131;
                    auVar129 = packssdw(auVar129,auVar129);
                    auVar129 = packsswb(auVar129,auVar129);
                    if ((auVar129._0_4_ >> 0x18 & 1) != 0) {
                      *(char *)(psVar45 + uVar41 * 2 + 0xffffffffffffffe8) = cVar10;
                    }
                    auVar129 = (auVar57 | _DAT_001505e0) ^ auVar125;
                    iVar159 = -(uint)(iVar16 < auVar129._0_4_);
                    auVar88._4_4_ = -(uint)(iVar39 < auVar129._4_4_);
                    iVar38 = -(uint)(iVar18 < auVar129._8_4_);
                    auVar88._12_4_ = -(uint)(iVar155 < auVar129._12_4_);
                    auVar111._4_4_ = iVar159;
                    auVar111._0_4_ = iVar159;
                    auVar111._8_4_ = iVar38;
                    auVar111._12_4_ = iVar38;
                    auVar78 = pshuflw(auVar78,auVar111,0xe8);
                    auVar87._4_4_ = -(uint)(auVar129._4_4_ == iVar39);
                    auVar87._12_4_ = -(uint)(auVar129._12_4_ == iVar155);
                    auVar87._0_4_ = auVar87._4_4_;
                    auVar87._8_4_ = auVar87._12_4_;
                    auVar82 = pshuflw(auVar52 & auVar83,auVar87,0xe8);
                    auVar88._0_4_ = auVar88._4_4_;
                    auVar88._8_4_ = auVar88._12_4_;
                    auVar129 = pshuflw(auVar78,auVar88,0xe8);
                    auVar129 = (auVar129 | auVar82 & auVar78) ^ auVar131;
                    auVar129 = packssdw(auVar129,auVar129);
                    auVar129 = packsswb(auVar129,auVar129);
                    if ((auVar129 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar45 + uVar41 * 2 + 0xffffffffffffffea) = cVar10;
                    }
                    auVar88 = auVar87 & auVar111 | auVar88;
                    auVar129 = packssdw(auVar88,auVar88);
                    auVar129 = packssdw(auVar129 ^ auVar131,auVar129 ^ auVar131);
                    auVar129 = packsswb(auVar129,auVar129);
                    if ((auVar129._4_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar45 + uVar41 * 2 + 0xffffffffffffffec) = cVar10;
                    }
                    auVar129 = (auVar57 | _DAT_001505d0) ^ auVar125;
                    iVar159 = -(uint)(iVar16 < auVar129._0_4_);
                    auVar123._4_4_ = -(uint)(iVar39 < auVar129._4_4_);
                    iVar38 = -(uint)(iVar18 < auVar129._8_4_);
                    auVar123._12_4_ = -(uint)(iVar155 < auVar129._12_4_);
                    auVar89._4_4_ = iVar159;
                    auVar89._0_4_ = iVar159;
                    auVar89._8_4_ = iVar38;
                    auVar89._12_4_ = iVar38;
                    auVar112._4_4_ = -(uint)(auVar129._4_4_ == iVar39);
                    auVar112._12_4_ = -(uint)(auVar129._12_4_ == iVar155);
                    auVar112._0_4_ = auVar112._4_4_;
                    auVar112._8_4_ = auVar112._12_4_;
                    auVar123._0_4_ = auVar123._4_4_;
                    auVar123._8_4_ = auVar123._12_4_;
                    auVar129 = auVar112 & auVar89 | auVar123;
                    auVar129 = packssdw(auVar129,auVar129);
                    auVar129 = packssdw(auVar129 ^ auVar131,auVar129 ^ auVar131);
                    auVar129 = packsswb(auVar129,auVar129);
                    if ((auVar129 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar45 + uVar41 * 2 + 0xffffffffffffffee) = cVar10;
                    }
                    auVar83 = pshufhw(auVar89,auVar89,0x84);
                    auVar134 = pshufhw(auVar112,auVar112,0x84);
                    auVar52 = pshufhw(auVar83,auVar123,0x84);
                    auVar83 = (auVar52 | auVar134 & auVar83) ^ auVar131;
                    auVar83 = packssdw(auVar83,auVar83);
                    auVar83 = packsswb(auVar83,auVar83);
                    if ((auVar83._6_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar45 + uVar41 * 2 + 0xfffffffffffffff0) = cVar10;
                    }
                    auVar83 = (auVar57 | _DAT_001505c0) ^ auVar125;
                    iVar159 = -(uint)(iVar16 < auVar83._0_4_);
                    auVar91._4_4_ = -(uint)(iVar39 < auVar83._4_4_);
                    iVar38 = -(uint)(iVar18 < auVar83._8_4_);
                    auVar91._12_4_ = -(uint)(iVar155 < auVar83._12_4_);
                    auVar113._4_4_ = iVar159;
                    auVar113._0_4_ = iVar159;
                    auVar113._8_4_ = iVar38;
                    auVar113._12_4_ = iVar38;
                    auVar129 = pshuflw(auVar129,auVar113,0xe8);
                    auVar90._4_4_ = -(uint)(auVar83._4_4_ == iVar39);
                    auVar90._12_4_ = -(uint)(auVar83._12_4_ == iVar155);
                    auVar90._0_4_ = auVar90._4_4_;
                    auVar90._8_4_ = auVar90._12_4_;
                    auVar82 = pshuflw(auVar82 & auVar78,auVar90,0xe8);
                    auVar91._0_4_ = auVar91._4_4_;
                    auVar91._8_4_ = auVar91._12_4_;
                    auVar78 = pshuflw(auVar129,auVar91,0xe8);
                    auVar78 = (auVar78 | auVar82 & auVar129) ^ auVar131;
                    auVar78 = packssdw(auVar78,auVar78);
                    auVar78 = packsswb(auVar78,auVar78);
                    if ((auVar78 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar45 + uVar41 * 2 + 0xfffffffffffffff2) = cVar10;
                    }
                    auVar91 = auVar90 & auVar113 | auVar91;
                    auVar78 = packssdw(auVar91,auVar91);
                    auVar78 = packssdw(auVar78 ^ auVar131,auVar78 ^ auVar131);
                    auVar78 = packsswb(auVar78,auVar78);
                    if ((auVar78._8_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar45 + uVar41 * 2 + 0xfffffffffffffff4) = cVar10;
                    }
                    auVar78 = (auVar57 | _DAT_001505b0) ^ auVar125;
                    iVar159 = -(uint)(iVar16 < auVar78._0_4_);
                    auVar124._4_4_ = -(uint)(iVar39 < auVar78._4_4_);
                    iVar38 = -(uint)(iVar18 < auVar78._8_4_);
                    auVar124._12_4_ = -(uint)(iVar155 < auVar78._12_4_);
                    auVar92._4_4_ = iVar159;
                    auVar92._0_4_ = iVar159;
                    auVar92._8_4_ = iVar38;
                    auVar92._12_4_ = iVar38;
                    auVar114._4_4_ = -(uint)(auVar78._4_4_ == iVar39);
                    auVar114._12_4_ = -(uint)(auVar78._12_4_ == iVar155);
                    auVar114._0_4_ = auVar114._4_4_;
                    auVar114._8_4_ = auVar114._12_4_;
                    auVar124._0_4_ = auVar124._4_4_;
                    auVar124._8_4_ = auVar124._12_4_;
                    auVar78 = auVar114 & auVar92 | auVar124;
                    auVar78 = packssdw(auVar78,auVar78);
                    auVar78 = packssdw(auVar78 ^ auVar131,auVar78 ^ auVar131);
                    auVar78 = packsswb(auVar78,auVar78);
                    if ((auVar78 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(char *)(psVar45 + uVar41 * 2 + 0xfffffffffffffff6) = cVar10;
                    }
                    auVar83 = pshufhw(auVar92,auVar92,0x84);
                    auVar134 = pshufhw(auVar114,auVar114,0x84);
                    auVar52 = pshufhw(auVar83,auVar124,0x84);
                    auVar83 = (auVar52 | auVar134 & auVar83) ^ auVar131;
                    auVar83 = packssdw(auVar83,auVar83);
                    auVar83 = packsswb(auVar83,auVar83);
                    if ((auVar83._10_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar45 + uVar41 * 2 + 0xfffffffffffffff8) = cVar10;
                    }
                    auVar83 = (auVar57 | _DAT_001505a0) ^ auVar125;
                    iVar159 = -(uint)(iVar16 < auVar83._0_4_);
                    auVar94._4_4_ = -(uint)(iVar39 < auVar83._4_4_);
                    iVar38 = -(uint)(iVar18 < auVar83._8_4_);
                    auVar94._12_4_ = -(uint)(iVar155 < auVar83._12_4_);
                    auVar115._4_4_ = iVar159;
                    auVar115._0_4_ = iVar159;
                    auVar115._8_4_ = iVar38;
                    auVar115._12_4_ = iVar38;
                    auVar78 = pshuflw(auVar78,auVar115,0xe8);
                    auVar93._4_4_ = -(uint)(auVar83._4_4_ == iVar39);
                    auVar93._12_4_ = -(uint)(auVar83._12_4_ == iVar155);
                    auVar93._0_4_ = auVar93._4_4_;
                    auVar93._8_4_ = auVar93._12_4_;
                    in_XMM6 = pshuflw(auVar82 & auVar129,auVar93,0xe8);
                    in_XMM6 = in_XMM6 & auVar78;
                    auVar94._0_4_ = auVar94._4_4_;
                    auVar94._8_4_ = auVar94._12_4_;
                    auVar78 = pshuflw(auVar78,auVar94,0xe8);
                    auVar78 = (auVar78 | in_XMM6) ^ auVar131;
                    auVar78 = packssdw(auVar78,auVar78);
                    in_XMM5 = packsswb(auVar78,auVar78);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar45 + uVar41 * 2 + 0xfffffffffffffffa) = cVar10;
                    }
                    auVar94 = auVar93 & auVar115 | auVar94;
                    auVar78 = packssdw(auVar94,auVar94);
                    auVar78 = packssdw(auVar78 ^ auVar131,auVar78 ^ auVar131);
                    auVar78 = packsswb(auVar78,auVar78);
                    if ((auVar78._12_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar45 + uVar41 * 2 + 0xfffffffffffffffc) = cVar10;
                    }
                    auVar57 = (auVar57 | _DAT_00150590) ^ auVar125;
                    auVar116._0_4_ = -(uint)(iVar16 < auVar57._0_4_);
                    auVar116._4_4_ = -(uint)(iVar39 < auVar57._4_4_);
                    auVar116._8_4_ = -(uint)(iVar18 < auVar57._8_4_);
                    auVar116._12_4_ = -(uint)(iVar155 < auVar57._12_4_);
                    auVar95._4_4_ = auVar116._0_4_;
                    auVar95._0_4_ = auVar116._0_4_;
                    auVar95._8_4_ = auVar116._8_4_;
                    auVar95._12_4_ = auVar116._8_4_;
                    auVar51._4_4_ = -(uint)(auVar57._4_4_ == iVar39);
                    auVar51._12_4_ = -(uint)(auVar57._12_4_ == iVar155);
                    auVar51._0_4_ = auVar51._4_4_;
                    auVar51._8_4_ = auVar51._12_4_;
                    auVar59._4_4_ = auVar116._4_4_;
                    auVar59._0_4_ = auVar116._4_4_;
                    auVar59._8_4_ = auVar116._12_4_;
                    auVar59._12_4_ = auVar116._12_4_;
                    auVar57 = packssdw(auVar116,auVar51 & auVar95 | auVar59);
                    auVar57 = packssdw(auVar57 ^ auVar131,auVar57 ^ auVar131);
                    auVar57 = packsswb(auVar57,auVar57);
                    if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar45 + uVar41 * 2 + 0xfffffffffffffffe) = cVar10;
                    }
                    auVar129 = pshufhw(auVar95,auVar95,0x84);
                    auVar57 = pshufhw(auVar51,auVar51,0x84);
                    auVar78 = pshufhw(auVar59,auVar59,0x84);
                    auVar57 = packssdw(auVar57 & auVar129,(auVar78 | auVar57 & auVar129) ^ auVar131)
                    ;
                    auVar57 = packsswb(auVar57,auVar57);
                    if ((auVar57._14_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar45 + uVar41 * 2) = cVar10;
                    }
                    uVar41 = uVar41 + 0x10;
                  } while (((ulong)uVar15 + 0xf & 0xfffffffffffffff0) != uVar41);
                }
                uVar43 = uVar43 + 1;
                psVar45 = (stbi__uint16 *)((long)psVar45 + 1);
                psVar44 = psVar44 + 1;
                local_8948 = (stbi__uint16 *)((long)local_8948 + 1);
                local_8968 = local_8968 + 1;
              } while (uVar43 != 4);
            }
            else {
              stbi__skip(s,uVar13 * uVar29 * 2);
              lVar35 = (ulong)((uVar17 | uVar19) * (uVar34 | uVar42)) - 1;
              auVar130._8_4_ = (int)lVar35;
              auVar130._0_8_ = lVar35;
              auVar130._12_4_ = (int)((ulong)lVar35 >> 0x20);
              psVar44 = data_02 + 0x1e;
              uVar43 = 0;
              auVar125 = _DAT_00150590;
              auVar48 = _DAT_001505a0;
              auVar131 = _DAT_001505b0;
              auVar57 = _DAT_001505c0;
              auVar78 = _DAT_001505d0;
              auVar129 = _DAT_001505e0;
              auVar82 = _DAT_001505f0;
              auVar83 = _DAT_001504f0;
              do {
                if (uVar43 < uVar13) {
                  iVar12 = stbi__psd_decode_rle(s,(stbi_uc *)((long)data_02 + uVar43),iVar36);
                  auVar125 = _DAT_00150590;
                  auVar48 = _DAT_001505a0;
                  auVar131 = _DAT_001505b0;
                  auVar57 = _DAT_001505c0;
                  auVar78 = _DAT_001505d0;
                  auVar129 = _DAT_001505e0;
                  auVar82 = _DAT_001505f0;
                  auVar83 = _DAT_001504f0;
                  if (iVar12 == 0) {
                    free(data_02);
                    puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
                    pcVar30 = "corrupt";
                    goto LAB_00128ae8;
                  }
                }
                else if (0 < iVar36) {
                  cVar10 = -(uVar43 == 3);
                  uVar41 = 0;
                  do {
                    auVar46._8_4_ = (int)uVar41;
                    auVar46._0_8_ = uVar41;
                    auVar46._12_4_ = (int)(uVar41 >> 0x20);
                    auVar52 = auVar130 ^ _DAT_00150500;
                    auVar134 = (auVar46 | auVar83) ^ _DAT_00150500;
                    iVar12 = auVar52._0_4_;
                    iVar155 = -(uint)(iVar12 < auVar134._0_4_);
                    iVar16 = auVar52._4_4_;
                    auVar61._4_4_ = -(uint)(iVar16 < auVar134._4_4_);
                    iVar39 = auVar52._8_4_;
                    iVar159 = -(uint)(iVar39 < auVar134._8_4_);
                    iVar18 = auVar52._12_4_;
                    auVar61._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
                    auVar97._4_4_ = iVar155;
                    auVar97._0_4_ = iVar155;
                    auVar97._8_4_ = iVar159;
                    auVar97._12_4_ = iVar159;
                    auVar52 = pshuflw(in_XMM5,auVar97,0xe8);
                    auVar60._4_4_ = -(uint)(auVar134._4_4_ == iVar16);
                    auVar60._12_4_ = -(uint)(auVar134._12_4_ == iVar18);
                    auVar60._0_4_ = auVar60._4_4_;
                    auVar60._8_4_ = auVar60._12_4_;
                    auVar136 = pshuflw(in_XMM6,auVar60,0xe8);
                    auVar61._0_4_ = auVar61._4_4_;
                    auVar61._8_4_ = auVar61._12_4_;
                    auVar134 = pshuflw(auVar52,auVar61,0xe8);
                    auVar126._8_4_ = 0xffffffff;
                    auVar126._0_8_ = 0xffffffffffffffff;
                    auVar126._12_4_ = 0xffffffff;
                    auVar52 = (auVar134 | auVar136 & auVar52) ^ auVar126;
                    auVar52 = packssdw(auVar52,auVar52);
                    if ((auVar52 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar44 + uVar41 * 2 + 0xffffffffffffffe2) = cVar10;
                    }
                    auVar61 = auVar60 & auVar97 | auVar61;
                    auVar52 = packssdw(auVar61,auVar61);
                    auVar52 = packssdw(auVar52 ^ auVar126,auVar52 ^ auVar126);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52._0_4_ >> 8 & 1) != 0) {
                      *(char *)(psVar44 + uVar41 * 2 + 0xffffffffffffffe4) = cVar10;
                    }
                    auVar52 = (auVar46 | auVar82) ^ _DAT_00150500;
                    iVar155 = -(uint)(iVar12 < auVar52._0_4_);
                    auVar118._4_4_ = -(uint)(iVar16 < auVar52._4_4_);
                    iVar159 = -(uint)(iVar39 < auVar52._8_4_);
                    auVar118._12_4_ = -(uint)(iVar18 < auVar52._12_4_);
                    auVar62._4_4_ = iVar155;
                    auVar62._0_4_ = iVar155;
                    auVar62._8_4_ = iVar159;
                    auVar62._12_4_ = iVar159;
                    auVar98._4_4_ = -(uint)(auVar52._4_4_ == iVar16);
                    auVar98._12_4_ = -(uint)(auVar52._12_4_ == iVar18);
                    auVar98._0_4_ = auVar98._4_4_;
                    auVar98._8_4_ = auVar98._12_4_;
                    auVar118._0_4_ = auVar118._4_4_;
                    auVar118._8_4_ = auVar118._12_4_;
                    auVar52 = auVar98 & auVar62 | auVar118;
                    auVar52 = packssdw(auVar52,auVar52);
                    auVar52 = packssdw(auVar52 ^ auVar126,auVar52 ^ auVar126);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52._0_4_ >> 0x10 & 1) != 0) {
                      *(char *)(psVar44 + uVar41 * 2 + 0xffffffffffffffe6) = cVar10;
                    }
                    auVar134 = pshufhw(auVar62,auVar62,0x84);
                    auVar72 = pshufhw(auVar98,auVar98,0x84);
                    auVar136 = pshufhw(auVar134,auVar118,0x84);
                    auVar134 = (auVar136 | auVar72 & auVar134) ^ auVar126;
                    auVar134 = packssdw(auVar134,auVar134);
                    auVar134 = packsswb(auVar134,auVar134);
                    if ((auVar134._0_4_ >> 0x18 & 1) != 0) {
                      *(char *)(psVar44 + uVar41 * 2 + 0xffffffffffffffe8) = cVar10;
                    }
                    auVar134 = (auVar46 | auVar129) ^ _DAT_00150500;
                    iVar155 = -(uint)(iVar12 < auVar134._0_4_);
                    auVar64._4_4_ = -(uint)(iVar16 < auVar134._4_4_);
                    iVar159 = -(uint)(iVar39 < auVar134._8_4_);
                    auVar64._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
                    auVar99._4_4_ = iVar155;
                    auVar99._0_4_ = iVar155;
                    auVar99._8_4_ = iVar159;
                    auVar99._12_4_ = iVar159;
                    auVar52 = pshuflw(auVar52,auVar99,0xe8);
                    auVar63._4_4_ = -(uint)(auVar134._4_4_ == iVar16);
                    auVar63._12_4_ = -(uint)(auVar134._12_4_ == iVar18);
                    auVar63._0_4_ = auVar63._4_4_;
                    auVar63._8_4_ = auVar63._12_4_;
                    auVar136 = pshuflw(auVar126,auVar63,0xe8);
                    auVar64._0_4_ = auVar64._4_4_;
                    auVar64._8_4_ = auVar64._12_4_;
                    auVar134 = pshuflw(auVar52,auVar64,0xe8);
                    auVar127._8_4_ = 0xffffffff;
                    auVar127._0_8_ = 0xffffffffffffffff;
                    auVar127._12_4_ = 0xffffffff;
                    auVar52 = (auVar134 | auVar136 & auVar52) ^ auVar127;
                    auVar52 = packssdw(auVar52,auVar52);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar44 + uVar41 * 2 + 0xffffffffffffffea) = cVar10;
                    }
                    auVar64 = auVar63 & auVar99 | auVar64;
                    auVar52 = packssdw(auVar64,auVar64);
                    auVar52 = packssdw(auVar52 ^ auVar127,auVar52 ^ auVar127);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52._4_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar44 + uVar41 * 2 + 0xffffffffffffffec) = cVar10;
                    }
                    auVar52 = (auVar46 | auVar78) ^ _DAT_00150500;
                    iVar155 = -(uint)(iVar12 < auVar52._0_4_);
                    auVar119._4_4_ = -(uint)(iVar16 < auVar52._4_4_);
                    iVar159 = -(uint)(iVar39 < auVar52._8_4_);
                    auVar119._12_4_ = -(uint)(iVar18 < auVar52._12_4_);
                    auVar65._4_4_ = iVar155;
                    auVar65._0_4_ = iVar155;
                    auVar65._8_4_ = iVar159;
                    auVar65._12_4_ = iVar159;
                    auVar100._4_4_ = -(uint)(auVar52._4_4_ == iVar16);
                    auVar100._12_4_ = -(uint)(auVar52._12_4_ == iVar18);
                    auVar100._0_4_ = auVar100._4_4_;
                    auVar100._8_4_ = auVar100._12_4_;
                    auVar119._0_4_ = auVar119._4_4_;
                    auVar119._8_4_ = auVar119._12_4_;
                    auVar52 = auVar100 & auVar65 | auVar119;
                    auVar52 = packssdw(auVar52,auVar52);
                    auVar52 = packssdw(auVar52 ^ auVar127,auVar52 ^ auVar127);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar44 + uVar41 * 2 + 0xffffffffffffffee) = cVar10;
                    }
                    auVar134 = pshufhw(auVar65,auVar65,0x84);
                    auVar72 = pshufhw(auVar100,auVar100,0x84);
                    auVar136 = pshufhw(auVar134,auVar119,0x84);
                    auVar134 = (auVar136 | auVar72 & auVar134) ^ auVar127;
                    auVar134 = packssdw(auVar134,auVar134);
                    auVar134 = packsswb(auVar134,auVar134);
                    if ((auVar134._6_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar44 + uVar41 * 2 + 0xfffffffffffffff0) = cVar10;
                    }
                    auVar134 = (auVar46 | auVar57) ^ _DAT_00150500;
                    iVar155 = -(uint)(iVar12 < auVar134._0_4_);
                    auVar67._4_4_ = -(uint)(iVar16 < auVar134._4_4_);
                    iVar159 = -(uint)(iVar39 < auVar134._8_4_);
                    auVar67._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
                    auVar101._4_4_ = iVar155;
                    auVar101._0_4_ = iVar155;
                    auVar101._8_4_ = iVar159;
                    auVar101._12_4_ = iVar159;
                    auVar52 = pshuflw(auVar52,auVar101,0xe8);
                    auVar66._4_4_ = -(uint)(auVar134._4_4_ == iVar16);
                    auVar66._12_4_ = -(uint)(auVar134._12_4_ == iVar18);
                    auVar66._0_4_ = auVar66._4_4_;
                    auVar66._8_4_ = auVar66._12_4_;
                    auVar136 = pshuflw(auVar127,auVar66,0xe8);
                    auVar67._0_4_ = auVar67._4_4_;
                    auVar67._8_4_ = auVar67._12_4_;
                    auVar134 = pshuflw(auVar52,auVar67,0xe8);
                    auVar128._8_4_ = 0xffffffff;
                    auVar128._0_8_ = 0xffffffffffffffff;
                    auVar128._12_4_ = 0xffffffff;
                    auVar52 = (auVar134 | auVar136 & auVar52) ^ auVar128;
                    auVar52 = packssdw(auVar52,auVar52);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar44 + uVar41 * 2 + 0xfffffffffffffff2) = cVar10;
                    }
                    auVar67 = auVar66 & auVar101 | auVar67;
                    auVar52 = packssdw(auVar67,auVar67);
                    auVar52 = packssdw(auVar52 ^ auVar128,auVar52 ^ auVar128);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52._8_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar44 + uVar41 * 2 + 0xfffffffffffffff4) = cVar10;
                    }
                    auVar52 = (auVar46 | auVar131) ^ _DAT_00150500;
                    iVar155 = -(uint)(iVar12 < auVar52._0_4_);
                    auVar120._4_4_ = -(uint)(iVar16 < auVar52._4_4_);
                    iVar159 = -(uint)(iVar39 < auVar52._8_4_);
                    auVar120._12_4_ = -(uint)(iVar18 < auVar52._12_4_);
                    auVar68._4_4_ = iVar155;
                    auVar68._0_4_ = iVar155;
                    auVar68._8_4_ = iVar159;
                    auVar68._12_4_ = iVar159;
                    auVar102._4_4_ = -(uint)(auVar52._4_4_ == iVar16);
                    auVar102._12_4_ = -(uint)(auVar52._12_4_ == iVar18);
                    auVar102._0_4_ = auVar102._4_4_;
                    auVar102._8_4_ = auVar102._12_4_;
                    auVar120._0_4_ = auVar120._4_4_;
                    auVar120._8_4_ = auVar120._12_4_;
                    auVar52 = auVar102 & auVar68 | auVar120;
                    auVar52 = packssdw(auVar52,auVar52);
                    auVar52 = packssdw(auVar52 ^ auVar128,auVar52 ^ auVar128);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(char *)(psVar44 + uVar41 * 2 + 0xfffffffffffffff6) = cVar10;
                    }
                    auVar134 = pshufhw(auVar68,auVar68,0x84);
                    auVar72 = pshufhw(auVar102,auVar102,0x84);
                    auVar136 = pshufhw(auVar134,auVar120,0x84);
                    auVar134 = (auVar136 | auVar72 & auVar134) ^ auVar128;
                    auVar134 = packssdw(auVar134,auVar134);
                    auVar134 = packsswb(auVar134,auVar134);
                    if ((auVar134._10_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar44 + uVar41 * 2 + 0xfffffffffffffff8) = cVar10;
                    }
                    auVar134 = (auVar46 | auVar48) ^ _DAT_00150500;
                    iVar155 = -(uint)(iVar12 < auVar134._0_4_);
                    auVar70._4_4_ = -(uint)(iVar16 < auVar134._4_4_);
                    iVar159 = -(uint)(iVar39 < auVar134._8_4_);
                    auVar70._12_4_ = -(uint)(iVar18 < auVar134._12_4_);
                    auVar103._4_4_ = iVar155;
                    auVar103._0_4_ = iVar155;
                    auVar103._8_4_ = iVar159;
                    auVar103._12_4_ = iVar159;
                    auVar52 = pshuflw(auVar52,auVar103,0xe8);
                    auVar69._4_4_ = -(uint)(auVar134._4_4_ == iVar16);
                    auVar69._12_4_ = -(uint)(auVar134._12_4_ == iVar18);
                    auVar69._0_4_ = auVar69._4_4_;
                    auVar69._8_4_ = auVar69._12_4_;
                    auVar136 = pshuflw(auVar128,auVar69,0xe8);
                    auVar70._0_4_ = auVar70._4_4_;
                    auVar70._8_4_ = auVar70._12_4_;
                    auVar134 = pshuflw(auVar52,auVar70,0xe8);
                    in_XMM6._8_4_ = 0xffffffff;
                    in_XMM6._0_8_ = 0xffffffffffffffff;
                    in_XMM6._12_4_ = 0xffffffff;
                    auVar52 = (auVar134 | auVar136 & auVar52) ^ in_XMM6;
                    auVar52 = packssdw(auVar52,auVar52);
                    in_XMM5 = packsswb(auVar52,auVar52);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar44 + uVar41 * 2 + 0xfffffffffffffffa) = cVar10;
                    }
                    auVar70 = auVar69 & auVar103 | auVar70;
                    auVar52 = packssdw(auVar70,auVar70);
                    auVar52 = packssdw(auVar52 ^ in_XMM6,auVar52 ^ in_XMM6);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52._12_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar44 + uVar41 * 2 + 0xfffffffffffffffc) = cVar10;
                    }
                    auVar52 = (auVar46 | auVar125) ^ _DAT_00150500;
                    auVar104._0_4_ = -(uint)(iVar12 < auVar52._0_4_);
                    auVar104._4_4_ = -(uint)(iVar16 < auVar52._4_4_);
                    auVar104._8_4_ = -(uint)(iVar39 < auVar52._8_4_);
                    auVar104._12_4_ = -(uint)(iVar18 < auVar52._12_4_);
                    auVar71._4_4_ = auVar104._0_4_;
                    auVar71._0_4_ = auVar104._0_4_;
                    auVar71._8_4_ = auVar104._8_4_;
                    auVar71._12_4_ = auVar104._8_4_;
                    auVar47._4_4_ = -(uint)(auVar52._4_4_ == iVar16);
                    auVar47._12_4_ = -(uint)(auVar52._12_4_ == iVar18);
                    auVar47._0_4_ = auVar47._4_4_;
                    auVar47._8_4_ = auVar47._12_4_;
                    auVar53._4_4_ = auVar104._4_4_;
                    auVar53._0_4_ = auVar104._4_4_;
                    auVar53._8_4_ = auVar104._12_4_;
                    auVar53._12_4_ = auVar104._12_4_;
                    auVar52 = packssdw(auVar104,auVar47 & auVar71 | auVar53);
                    auVar52 = packssdw(auVar52 ^ in_XMM6,auVar52 ^ in_XMM6);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar44 + uVar41 * 2 + 0xfffffffffffffffe) = cVar10;
                    }
                    auVar136 = pshufhw(auVar71,auVar71,0x84);
                    auVar52 = pshufhw(auVar47,auVar47,0x84);
                    auVar134 = pshufhw(auVar53,auVar53,0x84);
                    auVar52 = packssdw(auVar52 & auVar136,(auVar134 | auVar52 & auVar136) ^ in_XMM6)
                    ;
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52._14_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar44 + uVar41 * 2) = cVar10;
                    }
                    uVar41 = uVar41 + 0x10;
                  } while (((ulong)((uVar17 + uVar19) * (uVar34 + uVar42)) + 0xf &
                           0xfffffffffffffff0) != uVar41);
                }
                uVar43 = uVar43 + 1;
                psVar44 = (stbi__uint16 *)((long)psVar44 + 1);
              } while (uVar43 != 4);
            }
            if (3 < uVar13) {
              if (ri->bits_per_channel == 0x10) {
                if (0 < iVar36) {
                  uVar43 = 0;
                  do {
                    uVar3 = data_02[uVar43 * 4 + 3];
                    if ((uVar3 != 0) && (uVar3 != 0xffff)) {
                      fVar117 = 1.0 / ((float)uVar3 / 65535.0);
                      fVar96 = (1.0 - fVar117) * 65535.0;
                      auVar125._0_4_ =
                           (int)(fVar96 + fVar117 * (float)(*(uint *)(data_02 + uVar43 * 4) & 0xffff
                                                           ));
                      auVar125._4_4_ =
                           (int)(fVar96 + fVar117 * (float)(*(uint *)(data_02 + uVar43 * 4) >> 0x10)
                                );
                      auVar125._8_4_ = (int)(fVar96 + fVar117 * 0.0);
                      auVar125._12_4_ = (int)(fVar96 + fVar117 * 0.0);
                      auVar125 = pshuflw(auVar125,auVar125,0xe8);
                      *(int *)(data_02 + uVar43 * 4) = auVar125._0_4_;
                      data_02[uVar43 * 4 + 2] =
                           (stbi__uint16)(int)((float)data_02[uVar43 * 4 + 2] * fVar117 + fVar96);
                    }
                    uVar43 = uVar43 + 1;
                  } while ((uVar17 + uVar19) * (uVar34 + uVar42) != uVar43);
                }
              }
              else if (0 < iVar36) {
                uVar43 = 0;
                do {
                  bVar28 = *(byte *)((long)data_02 + uVar43 * 4 + 3);
                  if ((bVar28 != 0) && (bVar28 != 0xff)) {
                    fVar117 = 1.0 / ((float)bVar28 / 255.0);
                    fVar96 = (1.0 - fVar117) * 255.0;
                    *(char *)(data_02 + uVar43 * 2) =
                         (char)(int)((float)(byte)data_02[uVar43 * 2] * fVar117 + fVar96);
                    *(char *)((long)data_02 + uVar43 * 4 + 1) =
                         (char)(int)((float)*(byte *)((long)data_02 + uVar43 * 4 + 1) * fVar117 +
                                    fVar96);
                    *(char *)(data_02 + uVar43 * 2 + 1) =
                         (char)(int)((float)(byte)data_02[uVar43 * 2 + 1] * fVar117 + fVar96);
                  }
                  uVar43 = uVar43 + 1;
                } while ((uVar17 + uVar19) * (uVar34 + uVar42) != uVar43);
              }
            }
            if ((req_comp & 0xfffffffbU) != 0) {
              if (ri->bits_per_channel == 0x10) {
                data_02 = stbi__convert_format16(data_02,4,req_comp,uVar20,uVar29);
              }
              else {
                data_02 = (stbi__uint16 *)
                          stbi__convert_format((uchar *)data_02,4,req_comp,uVar20,uVar29);
              }
              if (data_02 == (stbi__uint16 *)0x0) {
                return (void *)0x0;
              }
            }
            if (comp != (int *)0x0) {
              *comp = 4;
            }
            *y = uVar29;
            *x = uVar20;
            return data_02;
          }
          goto LAB_0012a270;
        }
      }
    }
  }
LAB_001296b6:
  puVar22 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
  pcVar30 = "too large";
LAB_00128ae8:
  *puVar22 = pcVar30;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}